

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  char ch;
  bool escape;
  Lexer *this_local;
  
  bVar3 = false;
  while (uVar2 = this->pos,
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in),
        uVar2 < sVar4) {
    sVar4 = this->pos;
    this->pos = sVar4 + 1;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&this->m_in,sVar4);
    cVar1 = *pvVar5;
    if (cVar1 == '\\') {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if ((!bVar3) &&
         (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&this->m_in,this->tok_start), cVar1 == *pvVar5)) break;
      bVar3 = false;
    }
  }
  make_token(__return_storage_ptr__,this,String);
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
    bool escape {false};
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos++];
      if (ch == '\\') {
        escape = !escape;
      } else if (!escape && ch == m_in[tok_start]) {
        break;
      } else {
        escape = false;
      }
    }
    return make_token(Token::Kind::String);
  }